

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O0

void brotli::StoreDataWithHuffmanCodes
               (uint8_t *input,size_t start_pos,size_t mask,Command *commands,size_t n_commands,
               uint8_t *lit_depth,uint16_t *lit_bits,uint8_t *cmd_depth,uint16_t *cmd_bits,
               uint8_t *dist_depth,uint16_t *dist_bits,size_t *storage_ix,uint8_t *storage)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  Command *pCVar4;
  ulong uVar5;
  uint32_t distextra;
  uint32_t distnumextra;
  size_t dist_code;
  ulong uStack_80;
  uint8_t literal;
  size_t j;
  uint64_t lenextra;
  uint32_t lennumextra;
  size_t cmd_code;
  Command cmd;
  size_t i;
  size_t pos;
  uint8_t *lit_depth_local;
  size_t n_commands_local;
  Command *commands_local;
  size_t mask_local;
  size_t start_pos_local;
  uint8_t *input_local;
  
  cmd.dist_extra_ = 0;
  cmd.cmd_prefix_ = 0;
  cmd.dist_prefix_ = 0;
  i = start_pos;
  for (; (ulong)cmd._16_8_ < n_commands; cmd._16_8_ = cmd._16_8_ + 1) {
    pCVar4 = commands + cmd._16_8_;
    uVar1._0_4_ = pCVar4->insert_len_;
    uVar1._4_4_ = pCVar4->copy_len_;
    uVar2 = pCVar4->cmd_extra_;
    uVar3._0_4_ = pCVar4->dist_extra_;
    uVar3._4_2_ = pCVar4->cmd_prefix_;
    uVar3._6_2_ = pCVar4->dist_prefix_;
    uVar5 = uVar3 >> 0x20 & 0xffff;
    WriteBits((ulong)cmd_depth[uVar5],(ulong)cmd_bits[uVar5],storage_ix,storage);
    WriteBits(uVar2 >> 0x30,uVar2 & 0xffffffffffff,storage_ix,storage);
    for (uStack_80 = uVar1 & 0xffffffff; uStack_80 != 0; uStack_80 = uStack_80 - 1) {
      WriteBits((ulong)lit_depth[input[i & mask]],(ulong)lit_bits[input[i & mask]],storage_ix,
                storage);
      i = i + 1;
    }
    i = (uint)uVar1._4_4_ + i;
    if ((uVar1._4_4_ != 0) && (0x7f < (ushort)uVar3._4_2_)) {
      WriteBits((ulong)dist_depth[uVar3 >> 0x30],(ulong)dist_bits[uVar3 >> 0x30],storage_ix,storage)
      ;
      WriteBits((ulong)((uint)(undefined4)uVar3 >> 0x18),(ulong)((undefined4)uVar3 & 0xffffff),
                storage_ix,storage);
    }
  }
  return;
}

Assistant:

void StoreDataWithHuffmanCodes(const uint8_t* input,
                               size_t start_pos,
                               size_t mask,
                               const brotli::Command *commands,
                               size_t n_commands,
                               const uint8_t* lit_depth,
                               const uint16_t* lit_bits,
                               const uint8_t* cmd_depth,
                               const uint16_t* cmd_bits,
                               const uint8_t* dist_depth,
                               const uint16_t* dist_bits,
                               size_t* storage_ix,
                               uint8_t* storage) {
  size_t pos = start_pos;
  for (size_t i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    const size_t cmd_code = cmd.cmd_prefix_;
    const uint32_t lennumextra = static_cast<uint32_t>(cmd.cmd_extra_ >> 48);
    const uint64_t lenextra = cmd.cmd_extra_ & 0xffffffffffffUL;
    WriteBits(cmd_depth[cmd_code], cmd_bits[cmd_code], storage_ix, storage);
    WriteBits(lennumextra, lenextra, storage_ix, storage);
    for (size_t j = cmd.insert_len_; j != 0; --j) {
      const uint8_t literal = input[pos & mask];
      WriteBits(lit_depth[literal], lit_bits[literal], storage_ix, storage);
      ++pos;
    }
    pos += cmd.copy_len_;
    if (cmd.copy_len_ > 0 && cmd.cmd_prefix_ >= 128) {
      const size_t dist_code = cmd.dist_prefix_;
      const uint32_t distnumextra = cmd.dist_extra_ >> 24;
      const uint32_t distextra = cmd.dist_extra_ & 0xffffff;
      WriteBits(dist_depth[dist_code], dist_bits[dist_code],
                storage_ix, storage);
      WriteBits(distnumextra, distextra, storage_ix, storage);
    }
  }
}